

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O0

ArrayXZ * __thiscall IMLE::getMultiplePredictionErrorReductionDerivative(IMLE *this)

{
  reference pFVar1;
  reference piVar2;
  Scalar *pSVar3;
  reference scalar;
  StorageBaseType *matrix;
  long in_RDI;
  IMLE *in_stack_000002f0;
  int k;
  int j_1;
  X invRjSqPsij;
  int j;
  Scal sumH;
  ArrayXZ sumInvRjSqPsijGammajZetaj;
  ArrayX sumInvRjSqPsijGammaj;
  ArrayXZ sumInvRjSqPsijDelta_dGammaj;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  *in_stack_fffffffffffff948;
  NoAlias<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixBase> in_stack_fffffffffffff950;
  allocator_type *in_stack_fffffffffffff958;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
  *in_stack_fffffffffffff960;
  DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
  *in_stack_fffffffffffff968;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  *in_stack_fffffffffffff970;
  NoAlias<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixBase> in_stack_fffffffffffff978;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffff980;
  X *in_stack_fffffffffffff998;
  LinearExpert *in_stack_fffffffffffff9a0;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>
  *in_stack_fffffffffffff9a8;
  Scal in_stack_fffffffffffffc40;
  Z *in_stack_fffffffffffffc48;
  FastLinearExpert *in_stack_fffffffffffffc50;
  int local_27c;
  int local_c4;
  int local_ac;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_98;
  vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_78;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_58 [3];
  
  if ((*(byte *)(in_RDI + 0x289) & 1) == 0) {
    if ((*(byte *)(in_RDI + 0x288) & 1) == 0) {
      getMultiplePredictionsJacobian(in_stack_000002f0);
    }
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::clear((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
             *)0x302286);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::clear((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
             *)0x30229a);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff950.m_expression,
               (Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff948);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::resize((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffff980,(size_type)in_stack_fffffffffffff978.m_expression,
             (value_type *)in_stack_fffffffffffff970);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x3022f9);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix
              (in_stack_fffffffffffff950.m_expression,
               (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff948);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::resize((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)in_stack_fffffffffffff980,(size_type)in_stack_fffffffffffff978.m_expression,
             (value_type *)in_stack_fffffffffffff970);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0x302369)
    ;
    std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::allocator
              ((allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x3023a3);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)in_stack_fffffffffffff970,(size_type)in_stack_fffffffffffff968,
             (value_type *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~allocator
              ((allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x3023d7);
    std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::allocator
              ((allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x302411);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)in_stack_fffffffffffff970,(size_type)in_stack_fffffffffffff968,
             (value_type *)in_stack_fffffffffffff960,(allocator_type *)in_stack_fffffffffffff958);
    std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~allocator
              ((allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x302445);
    std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::allocator
              ((allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x30247f);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)in_stack_fffffffffffff970,(size_type)in_stack_fffffffffffff968,
             (value_type *)in_stack_fffffffffffff960,in_stack_fffffffffffff958);
    std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~allocator
              ((allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x3024b3);
    for (local_ac = 0; local_ac < *(int *)(in_RDI + 200); local_ac = local_ac + 1) {
      std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
      operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  *)(in_RDI + 0xb0),(long)local_ac);
      pFVar1 = std::
               vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
               operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0xb0),(long)local_ac);
      LinearExpert::getPredX(&pFVar1->super_LinearExpert);
      LinearExpert::queryHafterZ(in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
    }
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff960);
    for (local_c4 = 0; local_c4 < *(int *)(in_RDI + 200); local_c4 = local_c4 + 1) {
      std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
      operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                  *)(in_RDI + 0xb0),(long)local_c4);
      pFVar1 = std::
               vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
               operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0xb0),(long)local_c4);
      LinearExpert::get_h(&pFVar1->super_LinearExpert);
      FastLinearExpert::queryNewPredXVar
                (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff960,
                 (Index)in_stack_fffffffffffff958);
      pFVar1 = std::
               vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
               operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0xb0),(long)local_c4);
      LinearExpert::get_p_z(&pFVar1->super_LinearExpert);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                 in_stack_fffffffffffff950.m_expression,(Index)in_stack_fffffffffffff948);
      Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>>::operator*
                (in_stack_fffffffffffff9a8,(double *)in_stack_fffffffffffff9a0);
      Eigen::Matrix<double,-1,1,0,-1,1>::operator=
                ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff950.m_expression,
                 in_stack_fffffffffffff948);
      pFVar1 = std::
               vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
               operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0xb0),(long)local_c4);
      LinearExpert::get_dGamma(&pFVar1->super_LinearExpert);
      pFVar1 = std::
               vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
               operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0xb0),(long)local_c4);
      LinearExpert::get_dNewGamma(&pFVar1->super_LinearExpert);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator-
                ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                 in_stack_fffffffffffff978.m_expression,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff970);
      Eigen::
      DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::transpose((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   *)in_stack_fffffffffffff958);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
                ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff968,
                 (MatrixBase<Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                  *)in_stack_fffffffffffff960);
      piVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x140),(long)local_c4);
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::operator[](local_58,(long)*piVar2);
      Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::noalias
                ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff948)
      ;
      Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator+=
                ((NoAlias<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixBase> *)
                 in_stack_fffffffffffff970,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_0>_>
                  *)in_stack_fffffffffffff968);
      pFVar1 = std::
               vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
               operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0xb0),(long)local_c4);
      LinearExpert::getGamma(&pFVar1->super_LinearExpert);
      pFVar1 = std::
               vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
               operator[]((vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           *)(in_RDI + 0xb0),(long)local_c4);
      LinearExpert::getNewGamma(&pFVar1->super_LinearExpert);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator*=
                (in_stack_fffffffffffff980,(Scalar *)in_stack_fffffffffffff978.m_expression);
      piVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x140),(long)local_c4);
      std::
      vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
      ::operator[](&local_78,(long)*piVar2);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
                ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff970,
                 (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff968);
      Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::col
                ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff960,
                 (Index)in_stack_fffffffffffff958);
      Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>::
      transpose((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_> *)
                in_stack_fffffffffffff950.m_expression);
      Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
                ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff960,
                 (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                  *)in_stack_fffffffffffff958);
      piVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x140),(long)local_c4);
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::operator[](&local_98,(long)*piVar2);
      Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::noalias
                ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_fffffffffffff948)
      ;
      Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator+=
                ((NoAlias<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixBase> *)
                 in_stack_fffffffffffff970,
                 (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_0>_>
                  *)in_stack_fffffffffffff968);
    }
    for (local_27c = 0; local_27c < *(int *)(in_RDI + 0x284); local_27c = local_27c + 1) {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_fffffffffffff950.m_expression,(Index)in_stack_fffffffffffff948);
      if ((*pSVar3 != 0.0) || (NAN(*pSVar3))) {
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)(in_RDI + 0x1f0),(long)local_27c);
        Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::cwiseAbs2
                  ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff968)
        ;
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::operator[](&local_78,(long)local_27c);
        Eigen::
        MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>>
        ::cwiseProduct<Eigen::Matrix<double,_1,1,0,_1,1>>
                  ((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)in_stack_fffffffffffff978.m_expression,
                   (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff970)
        ;
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)(in_RDI + 0x250),(long)local_27c);
        Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::noalias
                  ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff948)
        ;
        Eigen::NoAlias<Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::MatrixBase>::operator=
                  ((NoAlias<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::MatrixBase> *)
                   in_stack_fffffffffffff970,
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)in_stack_fffffffffffff968);
        scalar = std::
                 vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                 ::operator[]((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                               *)(in_RDI + 0x1f0),(long)local_27c);
        matrix = (StorageBaseType *)
                 std::
                 vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                 ::operator[](&local_78,(long)local_27c);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        cwiseProduct<Eigen::Matrix<double,_1,1,0,_1,1>>
                  ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                   in_stack_fffffffffffff978.m_expression,
                   (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff970)
        ;
        Eigen::operator*((double *)scalar,matrix);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>_>
        ::asDiagonal((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                      *)in_stack_fffffffffffff958);
        std::
        vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      *)(in_RDI + 0x238),(long)local_27c);
        Eigen::
        DiagonalBase<Eigen::DiagonalWrapper<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>const>const>>
        ::operator*((DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>_>
                     *)in_stack_fffffffffffff968,
                    (MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                    in_stack_fffffffffffff960);
        std::
        vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      *)(in_RDI + 0x268),(long)local_27c);
        in_stack_fffffffffffff978 =
             Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::noalias
                       ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                        in_stack_fffffffffffff948);
        Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator=
                  ((NoAlias<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixBase> *)
                   in_stack_fffffffffffff970,
                   (MatrixBase<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1>_>
                    *)in_stack_fffffffffffff968);
        in_stack_fffffffffffff970 =
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)std::
                vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
                ::operator[]((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              *)(in_RDI + 0x1f0),(long)local_27c);
        Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::cwiseAbs2
                  ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffff968)
        ;
        Eigen::
        MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::asDiagonal((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)in_stack_fffffffffffff958);
        in_stack_fffffffffffff968 =
             (DiagonalBase<Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)std::
                vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
                ::operator[](local_58,(long)local_27c);
        in_stack_fffffffffffff960 =
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)std::
                vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
                ::operator[](&local_98,(long)local_27c);
        Eigen::operator*((double *)scalar,(StorageBaseType *)matrix);
        Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator-
                  ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                   in_stack_fffffffffffff978.m_expression,in_stack_fffffffffffff970);
        Eigen::
        DiagonalBase<Eigen::DiagonalWrapper<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,Eigen::Matrix<double,-1,1,0,-1,1>const>const>>
        ::operator*(in_stack_fffffffffffff968,in_stack_fffffffffffff960);
        in_stack_fffffffffffff958 =
             (allocator_type *)
             std::
             vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
             ::operator[]((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                           *)(in_RDI + 0x268),(long)local_27c);
        in_stack_fffffffffffff950 =
             Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::noalias
                       ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                        in_stack_fffffffffffff948);
        Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator+=
                  ((NoAlias<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixBase> *)
                   in_stack_fffffffffffff970,
                   (MatrixBase<Eigen::Product<Eigen::DiagonalWrapper<const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_1>_>
                    *)in_stack_fffffffffffff968);
      }
      else {
        std::
        vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      *)(in_RDI + 0x250),(long)local_27c);
        Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=
                  ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff950.m_expression,
                   (Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffff948);
        std::
        vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
        ::operator[]((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                      *)(in_RDI + 0x268),(long)local_27c);
        Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::operator=
                  (in_stack_fffffffffffff950.m_expression,
                   (Matrix<double,__1,__1,_0,__1,__1> *)in_stack_fffffffffffff948);
      }
    }
    *(undefined1 *)(in_RDI + 0x289) = 1;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x303034);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::~vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *)in_stack_fffffffffffff970);
    std::
    vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::~vector((vector<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)in_stack_fffffffffffff970);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::~vector((vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
               *)in_stack_fffffffffffff970);
  }
  return (ArrayXZ *)(in_RDI + 0x268);
}

Assistant:

IMLE_CLASS_TEMPLATE
IMLE_TYPENAME IMLE_base::ArrayXZ const &IMLE_base::getMultiplePredictionErrorReductionDerivative()
{
    if( !hasPredErrorReductionDrvt )
    {
        if( !hasPredJacobian )
            getMultiplePredictionsJacobian();

        predictionsErrorReduction.clear();
        predictionsErrorReductionJacobian.clear();
        predictionsErrorReduction.resize(nSolFound, zeroX);
        predictionsErrorReductionJacobian.resize(nSolFound, zeroXZ);

        ArrayXZ sumInvRjSqPsijDelta_dGammaj(nSolFound, zeroXZ);
        ArrayX sumInvRjSqPsijGammaj(nSolFound, zeroX);
        ArrayXZ sumInvRjSqPsijGammajZetaj(nSolFound, zeroXZ);

        Scal sumH = 0.0;
        for(int j = 0; j < M; j++)
            sumH += experts[j].queryHafterZ( experts[j].getPredX() );

        X invRjSqPsij;
        for(int j = 0; j < M; j++)
        {
            experts[j].queryNewPredXVar( zQuery, experts[j].get_h() / sumH );

            invRjSqPsij = fInvRj.col(j) * (experts[j].get_p_z() / varPhiAuxj(j));
            sumInvRjSqPsijDelta_dGammaj[sNearest[j]].noalias() += invRjSqPsij * ( experts[j].get_dGamma() - experts[j].get_dNewGamma() ).transpose();

            invRjSqPsij *= ( experts[j].getGamma() - experts[j].getNewGamma() ); //Using the same variable just to save resources...
            sumInvRjSqPsijGammaj[sNearest[j]] += invRjSqPsij;
            sumInvRjSqPsijGammajZetaj[sNearest[j]].noalias() += invRjSqPsij * zeta.col(j).transpose();
        }

       for( int k = 0; k < nSolFound; k++ )
            if(sum_p_z(k) == 0.0)  // Not likely, but...
            {
                predictionsErrorReduction[k] = zeroX;
                predictionsErrorReductionJacobian[k] = zeroXZ;
            }
            else
            {
                predictionsErrorReduction[k].noalias() = (predictionsVar[k].cwiseAbs2()).cwiseProduct(sumInvRjSqPsijGammaj[k]);
                predictionsErrorReductionJacobian[k].noalias() = (2.0*predictionsVar[k].cwiseProduct(sumInvRjSqPsijGammaj[k])).asDiagonal() * predictionsVarJacobian[k];
                predictionsErrorReductionJacobian[k].noalias() += predictionsVar[k].cwiseAbs2().asDiagonal() * (sumInvRjSqPsijDelta_dGammaj[k] - 2.0*sumInvRjSqPsijGammajZetaj[k]);
            }

        hasPredErrorReductionDrvt = true;
    }

    return predictionsErrorReductionJacobian;
}